

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Btree * findBtree(sqlite3 *pErrorDb,sqlite3 *pDb,char *zDb)

{
  uint uVar1;
  int iVar2;
  Parse *pParse;
  Btree *pBVar3;
  
  uVar1 = sqlite3FindDbName(pDb,zDb);
  if (uVar1 == 1) {
    pParse = (Parse *)sqlite3DbMallocRaw(pErrorDb,0x298);
    if (pParse == (Parse *)0x0) {
      sqlite3Error(pErrorDb,7,"out of memory");
      return (Btree *)0x0;
    }
    memset(pParse,0,0x298);
    pParse->db = pDb;
    iVar2 = sqlite3OpenTempDatabase(pParse);
    if (iVar2 != 0) {
      sqlite3Error(pErrorDb,pParse->rc,"%s",pParse->zErrMsg);
      sqlite3DbFree(pErrorDb,pParse->zErrMsg);
      sqlite3DbFree(pErrorDb,pParse);
      return (Btree *)0x0;
    }
    sqlite3DbFree(pErrorDb,pParse->zErrMsg);
    sqlite3DbFree(pErrorDb,pParse);
  }
  if ((int)uVar1 < 0) {
    pBVar3 = (Btree *)0x0;
    sqlite3Error(pErrorDb,1,"unknown database %s",zDb);
  }
  else {
    pBVar3 = pDb->aDb[uVar1].pBt;
  }
  return pBVar3;
}

Assistant:

static Btree *findBtree(sqlite3 *pErrorDb, sqlite3 *pDb, const char *zDb){
  int i = sqlite3FindDbName(pDb, zDb);

  if( i==1 ){
    Parse *pParse;
    int rc = 0;
    pParse = sqlite3StackAllocZero(pErrorDb, sizeof(*pParse));
    if( pParse==0 ){
      sqlite3Error(pErrorDb, SQLITE_NOMEM, "out of memory");
      rc = SQLITE_NOMEM;
    }else{
      pParse->db = pDb;
      if( sqlite3OpenTempDatabase(pParse) ){
        sqlite3Error(pErrorDb, pParse->rc, "%s", pParse->zErrMsg);
        rc = SQLITE_ERROR;
      }
      sqlite3DbFree(pErrorDb, pParse->zErrMsg);
      sqlite3StackFree(pErrorDb, pParse);
    }
    if( rc ){
      return 0;
    }
  }

  if( i<0 ){
    sqlite3Error(pErrorDb, SQLITE_ERROR, "unknown database %s", zDb);
    return 0;
  }

  return pDb->aDb[i].pBt;
}